

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O2

void __thiscall haVoc::QMoveorder::next_phase(QMoveorder *this)

{
  uint uVar1;
  Score *cutoff;
  element_type *this_00;
  Score local_10;
  Score local_c;
  
  uVar1 = *(uint *)&(this->super_Moveorder).field_0x64;
  if (uVar1 < 9) {
    if ((0x16fU >> (uVar1 & 0x1f) & 1) != 0) goto LAB_001171a0;
    this_00 = (this->super_Moveorder).m_captures.
              super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_00->m_start < this_00->m_end) {
      return;
    }
    cutoff = &local_c;
  }
  else {
    if (1 < uVar1 - 9) {
      return;
    }
    this_00 = (this->super_Moveorder).m_quiets.
              super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_00->m_start < this_00->m_end) {
      return;
    }
    cutoff = &local_10;
  }
  *cutoff = ninf;
  ScoredMoves::create_chunk(this_00,cutoff);
  uVar1 = *(uint *)&(this->super_Moveorder).field_0x64;
LAB_001171a0:
  *(uint *)&(this->super_Moveorder).field_0x64 = uVar1 + 1;
  return;
}

Assistant:

void QMoveorder::next_phase() {
		if ((m_phase == HashMove) ||
			(m_phase == MateKiller1) ||
			(m_phase == MateKiller2) ||
			(m_phase == Killer1) ||
			(m_phase == Killer2) ||
			(m_phase == InitCaptures) ||
			(m_phase == InitQuiets))
			m_phase = Phase(m_phase + 1);
		else if ((m_phase == GoodCaptures || m_phase == BadCaptures) && m_captures->end()) {
			m_captures->create_chunk(Score::ninf); // mark bad captures
			m_phase = Phase(m_phase + 1);
		}
		else if ((m_phase == GoodQuiets || m_phase == BadQuiets) && m_quiets->end()) {
			m_quiets->create_chunk(Score::ninf); // mark bad quiet moves
			m_phase = Phase(m_phase + 1);
		}
	}